

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTSIZEDec(size_t *val,octet *der,size_t count,u32 tag)

{
  size_t sVar1;
  byte *pbVar2;
  u32 in_ECX;
  size_t in_RDX;
  octet *in_RSI;
  ulong *in_RDI;
  size_t pos;
  size_t v;
  size_t len;
  size_t l_count;
  size_t t_count;
  u32 t;
  ulong local_50;
  ulong local_48;
  ulong local_40 [2];
  size_t local_30;
  u32 local_28;
  u32 local_24;
  size_t local_20;
  octet *local_18;
  ulong *local_10;
  size_t local_8;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = derTDec(&local_28,in_RSI,in_RDX);
  if ((local_30 == 0xffffffffffffffff) || (local_28 != local_24)) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_18 = local_18 + local_30;
    local_20 = local_20 - local_30;
    sVar1 = derLDec(local_40,local_18,local_20);
    if ((sVar1 == 0xffffffffffffffff) || (9 < local_40[0])) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      pbVar2 = local_18 + sVar1;
      local_48 = 0;
      local_50 = 0;
      if ((((*pbVar2 & 0x80) == 0) &&
          (((*pbVar2 != 0 || (local_40[0] < 2)) || ((pbVar2[1] & 0x80) != 0)))) &&
         ((local_40[0] != 9 || (*pbVar2 == 0)))) {
        for (; local_50 < local_40[0]; local_50 = local_50 + 1) {
          local_48 = (ulong)pbVar2[local_50] | local_48 << 8;
        }
        if (local_10 != (ulong *)0x0) {
          *local_10 = local_48;
        }
        local_8 = local_30 + sVar1 + local_40[0];
      }
      else {
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  return local_8;
}

Assistant:

size_t derTSIZEDec(size_t* val, const octet der[], size_t count, u32 tag)
{
	u32 t;
	size_t t_count;
	size_t l_count;
	size_t len;
	// pre
	ASSERT(memIsNullOrValid(val, O_PER_S));
	ASSERT(val == 0 || memIsDisjoint2(val, O_PER_S, der, count));
	// декодировать T
	t_count = derTDec(&t, der, count);
	if (t_count == SIZE_MAX || t != tag)
		return SIZE_MAX;
	der += t_count, count -= t_count;
	// декодировать L
	l_count = derLDec(&len, der, count);
	if (l_count == SIZE_MAX || len > O_PER_S + 1)
		return SIZE_MAX;
	der += l_count, count -= l_count;
	// декодировать V
	{
		register size_t v = 0;
		size_t pos = 0;
		// в старшем октете установлен старший бит?
		// избыточный нулевой старший октет?
		// переполнение?
		if ((der[0] & 0x80) ||
			der[0] == 0 && len > 1 && (der[1] & 0x80) == 0 ||
			len == O_PER_S + 1 && der[0] != 0)
			return SIZE_MAX;
		// декодировать
		for (; pos < len; ++pos)
			v <<= 8, v |= der[pos];
		if (val)
			*val = v;
		v = 0;
	}
	return t_count + l_count + len;
}